

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodOptions::InternalSwap(MethodOptions *this,MethodOptions *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  UnknownFieldSet *other_00;
  
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_002b47f3;
LAB_002b47e6:
    other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_002b47e6;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002b47f3:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  bVar1 = this->deprecated_;
  this->deprecated_ = other->deprecated_;
  other->deprecated_ = bVar1;
  iVar3 = this->idempotency_level_;
  this->idempotency_level_ = other->idempotency_level_;
  other->idempotency_level_ = iVar3;
  return;
}

Assistant:

void MethodOptions::InternalSwap(MethodOptions* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  swap(deprecated_, other->deprecated_);
  swap(idempotency_level_, other->idempotency_level_);
}